

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_arm_shift_reg(TCGContext_conflict1 *tcg_ctx,TCGv_i32 var,int shiftop,TCGv_i32 shift,
                      int flags)

{
  int flags_local;
  TCGv_i32 shift_local;
  int shiftop_local;
  TCGv_i32 var_local;
  TCGContext_conflict1 *tcg_ctx_local;
  
  if (flags == 0) {
    switch(shiftop) {
    case 0:
      gen_shl(tcg_ctx,var,var,shift);
      break;
    case 1:
      gen_shr(tcg_ctx,var,var,shift);
      break;
    case 2:
      gen_sar(tcg_ctx,var,var,shift);
      break;
    case 3:
      tcg_gen_andi_i32_aarch64(tcg_ctx,shift,shift,0x1f);
      tcg_gen_rotr_i32_aarch64(tcg_ctx,var,var,shift);
    }
  }
  else {
    switch(shiftop) {
    case 0:
      gen_helper_shl_cc(tcg_ctx,var,tcg_ctx->cpu_env,var,shift);
      break;
    case 1:
      gen_helper_shr_cc(tcg_ctx,var,tcg_ctx->cpu_env,var,shift);
      break;
    case 2:
      gen_helper_sar_cc(tcg_ctx,var,tcg_ctx->cpu_env,var,shift);
      break;
    case 3:
      gen_helper_ror_cc(tcg_ctx,var,tcg_ctx->cpu_env,var,shift);
    }
  }
  tcg_temp_free_i32(tcg_ctx,shift);
  return;
}

Assistant:

static inline void gen_arm_shift_reg(TCGContext *tcg_ctx, TCGv_i32 var, int shiftop,
                                     TCGv_i32 shift, int flags)
{
    if (flags) {
        switch (shiftop) {
        case 0: gen_helper_shl_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        case 1: gen_helper_shr_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        case 2: gen_helper_sar_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        case 3: gen_helper_ror_cc(tcg_ctx, var, tcg_ctx->cpu_env, var, shift); break;
        }
    } else {
        switch (shiftop) {
        case 0:
            gen_shl(tcg_ctx, var, var, shift);
            break;
        case 1:
            gen_shr(tcg_ctx, var, var, shift);
            break;
        case 2:
            gen_sar(tcg_ctx, var, var, shift);
            break;
        case 3: tcg_gen_andi_i32(tcg_ctx, shift, shift, 0x1f);
                tcg_gen_rotr_i32(tcg_ctx, var, var, shift); break;
        }
    }
    tcg_temp_free_i32(tcg_ctx, shift);
}